

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O2

void __thiscall
llvm::raw_fd_ostream::raw_fd_ostream
          (raw_fd_ostream *this,StringRef Filename,error_code *EC,CreationDisposition Disp,
          FileAccess Access,OpenFlags Flags)

{
  error_category *peVar1;
  uint fd;
  error_code eVar2;
  int FD;
  StringRef local_50;
  Twine local_40;
  
  local_50.Length = Filename.Length;
  local_50.Data = Filename.Data;
  if ((Access & FA_Write) != 0) {
    if ((local_50.Length == 1) && (*local_50.Data == '-')) {
      fd = 1;
      peVar1 = (error_category *)std::_V2::system_category();
      EC->_M_value = 0;
      EC->_M_cat = peVar1;
      if ((Flags & F_Text) == F_None) {
        sys::ChangeStdoutToBinary();
      }
    }
    else {
      if ((Access & FA_Read) == 0) {
        Twine::Twine(&local_40,&local_50);
        eVar2 = sys::fs::openFileForWrite(&local_40,&FD,Disp,Flags,0x1b6);
      }
      else {
        Twine::Twine(&local_40,&local_50);
        eVar2 = sys::fs::openFileForReadWrite(&local_40,&FD,Disp,Flags,0x1b6);
      }
      EC->_M_value = eVar2._M_value;
      EC->_M_cat = eVar2._M_cat;
      fd = -(uint)(eVar2._M_value != 0) | FD;
    }
    raw_fd_ostream(this,fd,true,false);
    return;
  }
  __assert_fail("(Access & sys::fs::FA_Write) && \"Cannot make a raw_ostream from a read-only descriptor!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                ,0x1f8,
                "int getFD(StringRef, std::error_code &, sys::fs::CreationDisposition, sys::fs::FileAccess, sys::fs::OpenFlags)"
               );
}

Assistant:

raw_fd_ostream::raw_fd_ostream(StringRef Filename, std::error_code &EC,
                               sys::fs::CreationDisposition Disp,
                               sys::fs::FileAccess Access,
                               sys::fs::OpenFlags Flags)
    : raw_fd_ostream(getFD(Filename, EC, Disp, Access, Flags), true) {}